

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

fromBase64_helper_result
anon_unknown.dwarf_aef3eb::fromBase64_helper
          (char *input,qsizetype inputSize,char *output,Base64Options options)

{
  long lVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar10;
  fromBase64_helper_result fVar11;
  long lVar9;
  
  lVar1 = inputSize + -1;
  lVar8 = 0;
  lVar3 = 0;
  iVar4 = 0;
  uVar10 = 0;
  do {
    if (inputSize <= lVar8) {
      uVar5 = 0;
LAB_002d3f2d:
      fVar11._8_8_ = uVar5;
      fVar11.decodedLength = lVar3;
      return fVar11;
    }
    cVar2 = input[lVar8];
    iVar6 = -0x41;
    lVar9 = lVar8;
    if ((((byte)(cVar2 + 0xbfU) < 0x1a) || (iVar6 = -0x47, (byte)(cVar2 + 0x9fU) < 0x1a)) ||
       (iVar6 = 4, (byte)(cVar2 - 0x30U) < 10)) {
      uVar7 = iVar6 + cVar2;
      if (uVar7 != 0xffffffff) {
LAB_002d3e84:
        uVar10 = uVar10 << 6 | uVar7;
        if (iVar4 < 2) {
          iVar4 = iVar4 + 6;
        }
        else {
          iVar4 = iVar4 + -2;
          output[lVar3] = (char)(uVar10 >> ((byte)iVar4 & 0x1f));
          lVar3 = lVar3 + 1;
          uVar10 = uVar10 & ~(-1 << ((byte)iVar4 & 0x1f));
        }
      }
    }
    else {
      if (cVar2 == '_') {
        uVar7 = 0x3f;
LAB_002d3eee:
        if (((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                   super_QFlagsStorage<QByteArray::Base64Option>.i & 1) != 0) goto LAB_002d3e84;
      }
      else {
        if (cVar2 == '-') {
          uVar7 = 0x3e;
          goto LAB_002d3eee;
        }
        if (cVar2 == '/') {
          uVar7 = 0x3f;
LAB_002d3ee1:
          if (((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                     super_QFlagsStorage<QByteArray::Base64Option>.i & 1) == 0) goto LAB_002d3e84;
        }
        else if (cVar2 == '+') {
          uVar7 = 0x3e;
          goto LAB_002d3ee1;
        }
      }
      if (((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                 super_QFlagsStorage<QByteArray::Base64Option>.i & 4) != 0) {
        if ((cVar2 != '=') || ((inputSize & 3U) != 0)) {
          uVar5 = (ulong)((cVar2 != '=') + 1);
          lVar3 = 0;
          goto LAB_002d3f2d;
        }
        lVar9 = lVar1;
        if ((lVar8 != lVar1) && ((lVar8 != inputSize + -2 || (input[lVar1] != '=')))) {
          lVar3 = 0;
          uVar5 = 3;
          goto LAB_002d3f2d;
        }
      }
    }
    lVar8 = lVar9 + 1;
  } while( true );
}

Assistant:

fromBase64_helper_result fromBase64_helper(const char *input, qsizetype inputSize,
                                           char *output /* may alias input */,
                                           QByteArray::Base64Options options)
{
    fromBase64_helper_result result{ 0, QByteArray::Base64DecodingStatus::Ok };

    unsigned int buf = 0;
    int nbits = 0;

    qsizetype offset = 0;
    for (qsizetype i = 0; i < inputSize; ++i) {
        int ch = input[i];
        int d;

        if (ch >= 'A' && ch <= 'Z') {
            d = ch - 'A';
        } else if (ch >= 'a' && ch <= 'z') {
            d = ch - 'a' + 26;
        } else if (ch >= '0' && ch <= '9') {
            d = ch - '0' + 52;
        } else if (ch == '+' && (options & QByteArray::Base64UrlEncoding) == 0) {
            d = 62;
        } else if (ch == '-' && (options & QByteArray::Base64UrlEncoding) != 0) {
            d = 62;
        } else if (ch == '/' && (options & QByteArray::Base64UrlEncoding) == 0) {
            d = 63;
        } else if (ch == '_' && (options & QByteArray::Base64UrlEncoding) != 0) {
            d = 63;
        } else {
            if (options & QByteArray::AbortOnBase64DecodingErrors) {
                if (ch == '=') {
                    // can have 1 or 2 '=' signs, in both cases padding base64Size to
                    // a multiple of 4. Any other case is illegal.
                    if ((inputSize % 4) != 0) {
                        result.status = QByteArray::Base64DecodingStatus::IllegalInputLength;
                        return result;
                    } else if ((i == inputSize - 1) ||
                        (i == inputSize - 2 && input[++i] == '=')) {
                        d = -1; // ... and exit the loop, normally
                    } else {
                        result.status = QByteArray::Base64DecodingStatus::IllegalPadding;
                        return result;
                    }
                } else {
                    result.status = QByteArray::Base64DecodingStatus::IllegalCharacter;
                    return result;
                }
            } else {
                d = -1;
            }
        }

        if (d != -1) {
            buf = (buf << 6) | d;
            nbits += 6;
            if (nbits >= 8) {
                nbits -= 8;
                Q_ASSERT(offset < i);
                output[offset++] = buf >> nbits;
                buf &= (1 << nbits) - 1;
            }
        }
    }

    result.decodedLength = offset;
    return result;
}